

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O1

void EDCircles::choldc(double **a,int n,double **l)

{
  size_t __n;
  double *pdVar1;
  void *__s;
  double **ppdVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  double **ppdVar8;
  double dVar9;
  
  __n = (long)n * 8 + 8;
  uVar4 = 0xffffffffffffffff;
  if (-2 < n) {
    uVar4 = __n;
  }
  __s = operator_new__(uVar4);
  memset(__s,0,__n);
  if (0 < n) {
    uVar7 = 1;
    lVar5 = 2;
    uVar4 = uVar7;
    do {
      do {
        dVar9 = a[uVar4][uVar7];
        if (1 < uVar4) {
          lVar3 = lVar5;
          do {
            uVar6 = (int)lVar3 - 2;
            dVar9 = dVar9 - a[uVar4][uVar6] * a[uVar7][uVar6];
            lVar3 = lVar3 + -1;
          } while (2 < lVar3);
        }
        if (uVar4 == uVar7) {
          if (0.0 < dVar9) {
            if (dVar9 < 0.0) {
              dVar9 = sqrt(dVar9);
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            *(double *)((long)__s + uVar4 * 8) = dVar9;
          }
        }
        else {
          a[uVar7][uVar4] = dVar9 / *(double *)((long)__s + uVar4 * 8);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != n + 1);
      uVar7 = uVar4 + 1;
      lVar5 = lVar5 + 1;
      uVar4 = uVar7;
    } while (uVar7 != n + 1);
  }
  if (0 < n) {
    ppdVar8 = a + 1;
    uVar4 = 1;
    ppdVar2 = l;
    do {
      ppdVar2 = ppdVar2 + 1;
      pdVar1 = l[uVar4];
      lVar5 = 0;
      do {
        if (lVar5 == 0) {
          dVar9 = *(double *)((long)__s + uVar4 * 8);
          uVar7 = uVar4;
        }
        else {
          ppdVar2[lVar5][uVar4] = ppdVar8[lVar5][uVar4];
          dVar9 = 0.0;
          uVar7 = uVar4 + lVar5;
        }
        pdVar1[uVar7] = dVar9;
        lVar5 = lVar5 + 1;
      } while ((uVar4 - (n + 1)) + lVar5 != 0);
      uVar4 = uVar4 + 1;
      ppdVar8 = ppdVar8 + 1;
    } while (uVar4 != n + 1);
  }
  operator_delete__(__s);
  return;
}

Assistant:

void EDCircles::choldc(double ** a, int n, double ** l)
{
	int i, j, k;
	double sum;
	double *p = new double[n + 1];
	memset(p, 0, sizeof(double)*(n + 1));


	for (i = 1; i <= n; i++)
	{
		for (j = i; j <= n; j++)
		{
			for (sum = a[i][j], k = i - 1; k >= 1; k--) sum -= a[i][k] * a[j][k];
			if (i == j)
			{
				if (sum <= 0.0)
					// printf("\nA is not poitive definite!");
				{
				}
				else
					p[i] = sqrt(sum);
			}
			else
			{
				a[j][i] = sum / p[i];
			}
		}
	}
	for (i = 1; i <= n; i++) {
		for (j = i; j <= n; j++) {
			if (i == j)
				l[i][i] = p[i];
			else
			{
				l[j][i] = a[j][i];
				l[i][j] = 0.0;
			}
		} //end-for-inner
	} // end-for-outer

	delete[] p;
}